

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::entityDecl
          (AbstractDOMParser *this,DTDEntityDecl *entityDecl,bool param_2,bool param_3)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  XMLCh *pXVar5;
  undefined7 in_register_00000009;
  long *plVar3;
  
  iVar2 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3a])
                    (this->fDocument,(entityDecl->super_XMLEntityDecl).fName,param_2,
                     CONCAT71(in_register_00000009,param_3));
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  (**(code **)(*plVar3 + 0x198))(plVar3,(entityDecl->super_XMLEntityDecl).fPublicId);
  (**(code **)(*plVar3 + 0x1a0))(plVar3,(entityDecl->super_XMLEntityDecl).fSystemId);
  (**(code **)(*plVar3 + 400))(plVar3,(entityDecl->super_XMLEntityDecl).fNotationName);
  (**(code **)(*plVar3 + 0x1b8))(plVar3,(entityDecl->super_XMLEntityDecl).fBaseURI);
  iVar2 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x29])();
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))
                             ((long *)CONCAT44(extraout_var_00,iVar2),plVar3);
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x138))(plVar4);
  }
  bVar1 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar1) {
    XMLBuffer::append(this->fInternalSubset,L'<');
    XMLBuffer::append(this->fInternalSubset,L'!');
    XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgEntityString);
    XMLBuffer::append(this->fInternalSubset,L' ');
    XMLBuffer::append(this->fInternalSubset,(entityDecl->super_XMLEntityDecl).fName);
    pXVar5 = (XMLCh *)(**(code **)(*plVar3 + 0x140))(plVar3);
    if (pXVar5 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgPubIDString);
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,pXVar5);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    pXVar5 = (XMLCh *)(**(code **)(*plVar3 + 0x148))(plVar3);
    if (pXVar5 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgSysIDString);
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,pXVar5);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    pXVar5 = (XMLCh *)(**(code **)(*plVar3 + 0x150))(plVar3);
    if (pXVar5 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgNDATAString);
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,pXVar5);
    }
    pXVar5 = (entityDecl->super_XMLEntityDecl).fValue;
    if (pXVar5 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,pXVar5);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    XMLBuffer::append(this->fInternalSubset,L'>');
    return;
  }
  return;
}

Assistant:

void AbstractDOMParser::entityDecl
(
    const   DTDEntityDecl&  entityDecl
    , const bool
    , const bool
)
{
    DOMEntityImpl* entity = (DOMEntityImpl *) fDocument->createEntity(entityDecl.getName());

    entity->setPublicId(entityDecl.getPublicId());
    entity->setSystemId(entityDecl.getSystemId());
    entity->setNotationName(entityDecl.getNotationName());
    entity->setBaseURI(entityDecl.getBaseURI());

    DOMEntityImpl *previousDef = (DOMEntityImpl *)
	    fDocumentType->getEntities()->setNamedItem( entity );

    if (previousDef)
        previousDef->release();

    if (fDocumentType->isIntSubsetReading())
    {
        //add thes chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgEntityString);
        fInternalSubset.append(chSpace);

        fInternalSubset.append(entityDecl.getName());

        const XMLCh* id = entity->getPublicId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgPubIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }
        id = entity->getSystemId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgSysIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);

        }
        id = entity->getNotationName();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgNDATAString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(id);
        }
        id = entityDecl.getValue();
        if (id !=0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }

        fInternalSubset.append(chCloseAngle);
    }

}